

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall
wasm::Memory64Lowering::visitElementSegment(Memory64Lowering *this,ElementSegment *segment)

{
  char *pcVar1;
  Module *this_00;
  Expression *pEVar2;
  size_t sVar3;
  Table *pTVar4;
  Global *pGVar5;
  Module *pMVar6;
  Const *pCVar7;
  Global *curr;
  Name name;
  undefined1 local_c8 [8];
  ImportInfo info;
  Builder builder;
  
  pcVar1 = (segment->table).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    name.super_IString.str._M_str = pcVar1;
    name.super_IString.str._M_len = (segment->table).super_IString.str._M_len;
    pTVar4 = Module::getTable(this_00,name);
    if ((pTVar4->addressType).id == 3) {
      pEVar2 = segment->offset;
      if (pEVar2->_id == GlobalGetId) {
        pGVar5 = Module::getGlobal(this_00,(Name)pEVar2[1]);
        if (((pGVar5->super_Importable).module.super_IString.str._M_str != (char *)0x0) &&
           ((pGVar5->super_Importable).base.super_IString.str._M_str == _ZN4wasmL10TABLE_BASEE_1)) {
          ImportInfo::ImportInfo((ImportInfo *)local_c8,this_00);
          pcVar1 = _DAT_010b1dc8;
          sVar3 = TABLE_BASE32;
          if (info.wasm !=
              (Module *)
              info.importedGlobals.
              super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pMVar6 = info.wasm;
            do {
              curr = (Global *)
                     (pMVar6->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              if (((curr->super_Importable).module.super_IString.str._M_str ==
                   (pGVar5->super_Importable).module.super_IString.str._M_str) &&
                 ((curr->super_Importable).base.super_IString.str._M_str == _DAT_010b1dc8))
              goto LAB_0094a6c8;
              pMVar6 = (Module *)
                       &(pMVar6->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            } while (pMVar6 != (Module *)
                               info.importedGlobals.
                               super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          }
          info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
          pCVar7 = Builder::makeConst<int>
                             ((Builder *)
                              &info.importedTags.
                               super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,0);
          curr = (Global *)operator_new(0x50);
          (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
          (curr->type).id = 0;
          curr->init = (Expression *)0x0;
          *(undefined8 *)&curr->mutable_ = 0;
          (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
          (curr->super_Importable).base.super_IString.str._M_len = 0;
          *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
          (curr->super_Importable).module.super_IString.str._M_len = 0;
          (curr->super_Importable).super_Named.name.super_IString.str._M_len = sVar3;
          (curr->super_Importable).super_Named.name.super_IString.str._M_str = pcVar1;
          (curr->type).id = 2;
          curr->init = (Expression *)pCVar7;
          pcVar1 = (pGVar5->super_Importable).module.super_IString.str._M_str;
          (curr->super_Importable).module.super_IString.str._M_len =
               (pGVar5->super_Importable).module.super_IString.str._M_len;
          (curr->super_Importable).module.super_IString.str._M_str = pcVar1;
          pcVar1 = _DAT_010b1dc8;
          (curr->super_Importable).base.super_IString.str._M_len = TABLE_BASE32;
          (curr->super_Importable).base.super_IString.str._M_str = pcVar1;
          Module::addGlobal(this_00,curr);
LAB_0094a6c8:
          (pEVar2->type).id = 2;
          pcVar1 = (curr->super_Importable).super_Named.name.super_IString.str._M_str;
          *(size_t *)(pEVar2 + 1) =
               (curr->super_Importable).super_Named.name.super_IString.str._M_len;
          pEVar2[1].type.id = (uintptr_t)pcVar1;
          if (info.importedMemories.
              super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(info.importedMemories.
                            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)info.importedTags.
                                  super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)info.importedMemories.
                                  super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (info.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(info.importedTables.
                            super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)info.importedMemories.
                                  super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)info.importedTables.
                                  super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (info.importedFunctions.
              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(info.importedFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)info.importedTables.
                                  super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)info.importedFunctions.
                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (info.importedGlobals.
              super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)info.importedFunctions.
                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)info.importedGlobals.
                                  super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (info.wasm != (Module *)0x0) {
            operator_delete(info.wasm,
                            (long)info.importedGlobals.
                                  super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)info.wasm);
          }
        }
      }
      else {
        if (pEVar2->_id != ConstId) {
          handle_unreachable("unexpected elem offset",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                             ,0x117);
        }
        if (*(long *)(pEVar2 + 2) != 3) {
          __assert_fail("type == Type::i64",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x129,"int64_t wasm::Literal::geti64() const");
        }
        local_c8._0_4_ = *(undefined4 *)(pEVar2 + 1);
        info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
        Literal::operator=((Literal *)(pEVar2 + 1),(Literal *)local_c8);
        Literal::~Literal((Literal *)local_c8);
        (pEVar2->type).id = 2;
      }
    }
  }
  return;
}

Assistant:

void visitElementSegment(ElementSegment* segment) {
    auto& module = *getModule();

    // Passive segments don't have any offset to update.
    if (segment->table.isNull() || !module.getTable(segment->table)->is64()) {
      return;
    }

    if (auto* c = segment->offset->dynCast<Const>()) {
      c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
      c->type = Type::i32;
    } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
      auto* g = module.getGlobal(get->name);
      if (g->imported() && g->base == TABLE_BASE) {
        ImportInfo info(module);
        auto* memoryBase32 = info.getImportedGlobal(g->module, TABLE_BASE32);
        if (!memoryBase32) {
          Builder builder(module);
          memoryBase32 = builder
                           .makeGlobal(TABLE_BASE32,
                                       Type::i32,
                                       builder.makeConst(int32_t(0)),
                                       Builder::Immutable)
                           .release();
          memoryBase32->module = g->module;
          memoryBase32->base = TABLE_BASE32;
          module.addGlobal(memoryBase32);
        }
        // Use this alternative import when initializing the segment.
        assert(memoryBase32);
        get->type = Type::i32;
        get->name = memoryBase32->name;
      }
    } else {
      WASM_UNREACHABLE("unexpected elem offset");
    }
  }